

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::ConfigureStreamingOutput(UnitTestImpl *this)

{
  void *pvVar1;
  void *pvVar2;
  StreamingListener *this_00;
  size_type __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  pvVar1 = FLAGS_gtest_stream_result_to_abi_cxx11_;
  if (_DAT_00acd670 != 0) {
    pvVar2 = memchr(FLAGS_gtest_stream_result_to_abi_cxx11_,0x3a,_DAT_00acd670);
    __n = (long)pvVar2 - (long)pvVar1;
    if (__n == 0xffffffffffffffff || pvVar2 == (void *)0x0) {
      printf("WARNING: unrecognized streaming target \"%s\" ignored.\n",pvVar1);
      fflush(_stdout);
      return;
    }
    this_00 = (StreamingListener *)operator_new(0x10);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_40,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &FLAGS_gtest_stream_result_to_abi_cxx11_,0,__n);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &FLAGS_gtest_stream_result_to_abi_cxx11_,__n + 1,0xffffffffffffffff);
    StreamingListener::StreamingListener(this_00,&local_40,&local_60);
    TestEventRepeater::Append((this->listeners_).repeater_,(TestEventListener *)this_00);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

void UnitTestImpl::ConfigureStreamingOutput() {
  const std::string& target = GTEST_FLAG(stream_result_to);
  if (!target.empty()) {
    const size_t pos = target.find(':');
    if (pos != std::string::npos) {
      listeners()->Append(new StreamingListener(target.substr(0, pos),
                                                target.substr(pos+1)));
    } else {
      printf("WARNING: unrecognized streaming target \"%s\" ignored.\n",
             target.c_str());
      fflush(stdout);
    }
  }
}